

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_set_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,uv_membership membership)

{
  int iVar1;
  int *piVar2;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  int optname;
  ip_mreq mreq;
  int local_30;
  in_addr_t local_2c;
  in_addr_t local_28;
  int local_24;
  char *local_20;
  char *local_18;
  long local_10;
  int local_4;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_2c,0,8);
  if (local_20 == (char *)0x0) {
    local_28 = htonl(0);
  }
  else {
    local_28 = inet_addr(local_20);
  }
  local_2c = inet_addr(local_18);
  if (local_24 == 0) {
    local_30 = 0x24;
  }
  else {
    if (local_24 != 1) {
      return -0x16;
    }
    local_30 = 0x23;
  }
  iVar1 = setsockopt(*(int *)(local_10 + 0x80),0,local_30,&local_2c,8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    piVar2 = __errno_location();
    local_4 = -*piVar2;
  }
  return local_4;
}

Assistant:

int uv_udp_set_membership(uv_udp_t* handle,
                          const char* multicast_addr,
                          const char* interface_addr,
                          uv_membership membership) {
  struct ip_mreq mreq;
  int optname;

  memset(&mreq, 0, sizeof mreq);

  if (interface_addr) {
    mreq.imr_interface.s_addr = inet_addr(interface_addr);
  } else {
    mreq.imr_interface.s_addr = htonl(INADDR_ANY);
  }

  mreq.imr_multiaddr.s_addr = inet_addr(multicast_addr);

  switch (membership) {
  case UV_JOIN_GROUP:
    optname = IP_ADD_MEMBERSHIP;
    break;
  case UV_LEAVE_GROUP:
    optname = IP_DROP_MEMBERSHIP;
    break;
  default:
    return -EINVAL;
  }

  if (setsockopt(handle->io_watcher.fd,
                 IPPROTO_IP,
                 optname,
                 &mreq,
                 sizeof(mreq))) {
    return -errno;
  }

  return 0;
}